

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-ggml.cpp
# Opt level: O2

ggml_ftype ggml_parse_ftype(char *str)

{
  ggml_ftype gVar1;
  _Rb_tree_color _Var2;
  const_iterator cVar3;
  allocator<char> local_31;
  key_type local_30;
  
  if (*str == 'q') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,str,&local_31);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ggml_ftype>_>_>
            ::find(&GGML_FTYPE_MAP_abi_cxx11_._M_t,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if ((_Rb_tree_header *)cVar3._M_node ==
        &GGML_FTYPE_MAP_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
      fprintf(_stderr,"%s: unknown ftype \'%s\'\n","ggml_parse_ftype",str);
      _Var2 = ~_S_red;
    }
    else {
      _Var2 = cVar3._M_node[2]._M_color;
    }
    return _Var2;
  }
  gVar1 = atoi(str);
  return gVar1;
}

Assistant:

enum ggml_ftype ggml_parse_ftype(const char * str) {
    enum ggml_ftype ftype;
    if (str[0] == 'q') {
        const auto it = GGML_FTYPE_MAP.find(str);
        if (it == GGML_FTYPE_MAP.end()) {
            fprintf(stderr, "%s: unknown ftype '%s'\n", __func__, str);
            return GGML_FTYPE_UNKNOWN;
        }
        ftype = it->second;
    } else {
        ftype = (enum ggml_ftype) atoi(str);
    }

    return ftype;
}